

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::PIQBase::VerifyGetProgramResourceiv
          (PIQBase *this,GLuint program,GLenum programInterface,GLuint index,GLsizei propCount,
          GLenum *props,GLsizei expectedLength,GLint *expected,long *error)

{
  uint uVar1;
  uint uVar2;
  int i;
  ulong uVar3;
  GLsizei length;
  GLint params [1000];
  
  glu::CallLogWrapper::glGetProgramResourceiv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,
             programInterface,index,propCount,props,1000,&length,params);
  if (length < 1 || length != expectedLength) {
    *error = -1;
    anon_unknown_0::Output
              ("ERROR: Got length %d, expected %d\n",(ulong)(uint)length,(ulong)(uint)expectedLength
              );
    anon_unknown_0::Output
              ("CALL: glGetProgramResourceiv, with %d, %d\n",(ulong)programInterface,(ulong)index);
  }
  else {
    uVar3 = 0;
    do {
      uVar1 = params[uVar3];
      uVar2 = expected[uVar3];
      if (uVar1 != uVar2) {
        *error = -1;
        anon_unknown_0::Output
                  ("ERROR: Got %d, expected %d at: %d\n",(ulong)uVar1,(ulong)uVar2,
                   uVar3 & 0xffffffff);
        anon_unknown_0::Output
                  ("CALL: glGetProgramResourceiv, with %d, %d\n",(ulong)programInterface,
                   (ulong)index);
        expectedLength = length;
      }
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)expectedLength);
  }
  return;
}

Assistant:

virtual inline void VerifyGetProgramResourceiv(GLuint program, GLenum programInterface, GLuint index,
												   GLsizei propCount, const GLenum props[], GLsizei expectedLength,
												   const GLint expected[], long& error)
	{
		const GLsizei bufSize = 1000;
		GLsizei		  length;
		GLint		  params[bufSize];
		glGetProgramResourceiv(program, programInterface, index, propCount, props, bufSize, &length, params);
		if (length != expectedLength || length <= 0)
		{
			error = ERROR;
			Output("ERROR: Got length %d, expected %d\n", length, expectedLength);
			Output("CALL: glGetProgramResourceiv, with %d, %d\n", programInterface, index);
			return;
		}
		for (int i = 0; i < length; ++i)
		{
			if (params[i] != expected[i])
			{
				error = ERROR;
				Output("ERROR: Got %d, expected %d at: %d\n", params[i], expected[i], i);
				Output("CALL: glGetProgramResourceiv, with %d, %d\n", programInterface, index);
			}
		}
	}